

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

word * Gia_SimRsbFunc(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins,int fOnSet)

{
  int iVar1;
  word *p_00;
  word *pwVar2;
  int local_c8;
  int iFanin;
  int i;
  int iMint;
  int b;
  int s;
  word *pFanins [16];
  word *pFunc;
  word *pTruth;
  int nTruthWords;
  int fOnSet_local;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Gia_SimRsbMan_t *p_local;
  
  iVar1 = Vec_IntSize(vFanins);
  iVar1 = Abc_Truth6WordNum(iVar1);
  p_00 = (word *)calloc((long)iVar1,8);
  pFanins[0xf] = Vec_WrdEntryP(p->vSimsObj,p->nWords * iObj);
  memset(&b,0,0x80);
  iVar1 = Vec_IntSize(vFanins);
  if (0x10 < iVar1) {
    __assert_fail("Vec_IntSize(vFanins) <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1cf,"word *Gia_SimRsbFunc(Gia_SimRsbMan_t *, int, Vec_Int_t *, int)");
  }
  for (local_c8 = 0; iVar1 = Vec_IntSize(vFanins), local_c8 < iVar1; local_c8 = local_c8 + 1) {
    iVar1 = Vec_IntEntry(vFanins,local_c8);
    pwVar2 = Vec_WrdEntryP(p->vSimsObj,p->nWords * iVar1);
    *(word **)(&b + (long)local_c8 * 2) = pwVar2;
  }
  for (iMint = 0; iMint < p->nWords * 0x40; iMint = iMint + 1) {
    iVar1 = Abc_TtGetBit(p->pFunc[2],iMint);
    if ((iVar1 != 0) && (iVar1 = Abc_TtGetBit(pFanins[0xf],iMint), iVar1 == fOnSet)) {
      iFanin = 0;
      for (i = 0; iVar1 = Vec_IntSize(vFanins), i < iVar1; i = i + 1) {
        iVar1 = Abc_TtGetBit(*(word **)(&b + (long)i * 2),iMint);
        if (iVar1 != 0) {
          iFanin = 1 << ((byte)i & 0x1f) | iFanin;
        }
      }
      Abc_TtSetBit(p_00,iFanin);
    }
  }
  return p_00;
}

Assistant:

word * Gia_SimRsbFunc( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins, int fOnSet )
{
    int nTruthWords = Abc_Truth6WordNum( Vec_IntSize(vFanins) );
    word * pTruth   = ABC_CALLOC( word, nTruthWords ); 
    word * pFunc    = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    word * pFanins[16] = {NULL};  int s, b, iMint, i, iFanin;
    assert( Vec_IntSize(vFanins) <= 16 );
    Vec_IntForEachEntry( vFanins, iFanin, i )
        pFanins[i] = Vec_WrdEntryP( p->vSimsObj, p->nWords*iFanin );
    for ( s = 0; s < 64*p->nWords; s++ )
    {
        if ( !Abc_TtGetBit(p->pFunc[2], s) || Abc_TtGetBit(pFunc, s) != fOnSet )
            continue;
        iMint = 0;
        for ( b = 0; b < Vec_IntSize(vFanins); b++ )
            if ( Abc_TtGetBit(pFanins[b], s) )
                iMint |= 1 << b;
        Abc_TtSetBit( pTruth, iMint );
    }
    return pTruth;
}